

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O0

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  int iVar1;
  long in_RDX;
  int in_ESI;
  args_t *in_RDI;
  char *arg;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char *str;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  in_RDI->input = _stdin;
  in_RDI->output = _stdout;
  in_RDI->motif_list = (char *)0x0;
  in_RDI->rc = complement;
  in_RDI->match = exact;
  for (iVar2 = 1; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
    str = *(char **)(in_RDX + (long)iVar2 * 8);
    if ((*str == '-') && (str[1] == '-')) {
      iVar1 = strcmp(str + 2,"help");
      if (iVar1 == 0) {
        help();
      }
      else {
        ERROR("unknown argument: %s",str);
      }
    }
    else if (*str == '-') {
      iVar1 = strcmp(str + 1,"h");
      if (iVar1 == 0) {
        help();
      }
      else if (str[1] == 'o') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x109750);
        parse_output(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
      else if (str[1] == 'r') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x109783);
        parse_rc_option(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                       );
      }
      else if (str[1] == 'm') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x1097b3);
        parse_match_mode(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8
                                                ));
      }
      else if (str[1] == 'e') {
        next_arg((int *)in_RDI,in_stack_ffffffffffffffcc,(char **)0x1097e3);
        parse_motif((args_t *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),str);
      }
      else {
        ERROR("unknown argument: %s",str);
      }
    }
    else if (iVar2 == in_ESI + -1) {
      parse_input(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    else {
      ERROR("unknown argument: %s",str);
    }
  }
  if (in_RDI->motif_list == (char *)0x0) {
    ERROR("Required argument MOTIF_LIST was not provided");
  }
  return;
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
    input( stdin ),
    output( stdout ),
    rc ( DEFAULT_RC ),
    match (DEFAULT_MATCH),
    motif_list (NULL)
    {
        // skip arg[0], it's just the program name
        for (int i = 1; i < argc; ++i ) {
            const char * arg = argv[i];
            
            if ( arg[0] == '-' && arg[1] == '-' ) {
                if ( !strcmp( &arg[2], "help" ) ) help();
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else if ( arg[0] == '-' ) {
                if ( !strcmp( &arg[1], "h" ) ) help();
                else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
                else if (  arg[1] == 'r')  parse_rc_option ( next_arg (i, argc, argv) );
                else if (  arg[1] == 'm')  parse_match_mode( next_arg (i, argc, argv) );
                else if (  arg[1] == 'e')  parse_motif( next_arg (i, argc, argv) );
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else
                if (i == argc-1) {
                    parse_input (arg);
                } else {
                    ERROR( "unknown argument: %s", arg );
                }
        }
                
        if (motif_list == NULL) {
            ERROR ("Required argument MOTIF_LIST was not provided");
        }
    }